

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExprParserHelper.cxx
# Opt level: O2

int __thiscall cmExprParserHelper::ParseString(cmExprParserHelper *this,char *str,int verb)

{
  int iVar1;
  ostream *poVar2;
  int iVar3;
  yyscan_t yyscanner;
  
  if (str == (char *)0x0) {
    iVar3 = 0;
  }
  else {
    this->Verbose = verb;
    std::__cxx11::string::assign((char *)&this->InputBuffer);
    this->InputBufferPos = 0;
    this->CurrentLine = 0;
    this->Result = 0;
    cmExpr_yylex_init(&yyscanner);
    cmExpr_yyset_extra(this,yyscanner);
    iVar1 = cmExpr_yyparse(yyscanner);
    cmExpr_yylex_destroy(yyscanner);
    iVar3 = 0;
    if (iVar1 == 0) {
      iVar3 = 1;
      if (this->Verbose != 0) {
        poVar2 = std::operator<<((ostream *)&std::cerr,"Expanding [");
        poVar2 = std::operator<<(poVar2,str);
        poVar2 = std::operator<<(poVar2,"] produced: [");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->Result);
        poVar2 = std::operator<<(poVar2,"]");
        std::endl<char,std::char_traits<char>>(poVar2);
      }
    }
  }
  return iVar3;
}

Assistant:

int cmExprParserHelper::ParseString(const char* str, int verb)
{
  if ( !str)
    {
    return 0;
    }
  //printf("Do some parsing: %s\n", str);

  this->Verbose = verb;
  this->InputBuffer = str;
  this->InputBufferPos = 0;
  this->CurrentLine = 0;

  this->Result = 0;

  yyscan_t yyscanner;
  cmExpr_yylex_init(&yyscanner);
  cmExpr_yyset_extra(this, yyscanner);
  int res = cmExpr_yyparse(yyscanner);
  cmExpr_yylex_destroy(yyscanner);
  if ( res != 0 )
    {
    //str << "CAL_Parser returned: " << res << std::endl;
    //std::cerr << "When parsing: [" << str << "]" << std::endl;
    return 0;
    }

  this->CleanupParser();

  if ( Verbose )
    {
    std::cerr << "Expanding [" << str << "] produced: ["
              << this->Result << "]" << std::endl;
    }
  return 1;
}